

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_ObjDup(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  Wlc_Obj_t *pObj;
  
  if ((0 < iObj) && (iObj < p->nObjsAlloc)) {
    pWVar1 = p->pObjs;
    uVar2 = Wlc_ObjAlloc(pNew,*(ushort *)(pWVar1 + (uint)iObj) & 0x3f,
                         *(ushort *)(pWVar1 + (uint)iObj) >> 6 & 1,pWVar1[(uint)iObj].End,
                         pWVar1[(uint)iObj].Beg);
    if ((0 < (int)uVar2) && ((int)uVar2 < pNew->nObjsAlloc)) {
      pObj = pNew->pObjs + uVar2;
      Wlc_ObjCollectCopyFanins(p,iObj,vFanins);
      Wlc_ObjAddFanins(pNew,pObj,vFanins);
      if (iObj < (p->vCopies).nSize) {
        (p->vCopies).pArray[(uint)iObj] = uVar2;
        *(ushort *)pObj =
             (ushort)*(undefined4 *)pObj & 0xf7ff | *(ushort *)(pWVar1 + (uint)iObj) & 0x800;
        return uVar2;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

int Wlc_ObjDup( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    int iFaninNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
    Wlc_Obj_t * pObjNew = Wlc_NtkObj(pNew, iFaninNew);
    Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
    Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
    Wlc_ObjSetCopy( p, iObj, iFaninNew );
    pObjNew->fXConst = pObj->fXConst;
    return iFaninNew;
}